

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generics.c++
# Opt level: O0

Own<capnp::compiler::BrandScope,_std::nullptr_t> __thiscall
capnp::compiler::BrandScope::evaluateBrand
          (BrandScope *this,Resolver *resolver,ResolvedDecl *decl,Reader brand,uint index)

{
  uint64_t uVar1;
  Reader source;
  Reader type;
  unsigned_long uVar2;
  bool bVar3;
  Which WVar4;
  Which WVar5;
  uint uVar6;
  BrandScope *pBVar7;
  uint64_t uVar8;
  NullableValue<kj::ArrayPtr<capnp::compiler::BrandedDecl>_> *other;
  ArrayPtr<capnp::compiler::BrandedDecl> *pAVar9;
  NullableValue<capnp::compiler::Resolver::ResolvedDecl> *other_00;
  ResolvedDecl *pRVar10;
  undefined4 in_register_0000000c;
  unsigned_long *params_1;
  BrandScope *extraout_RDX;
  uint in_R8D;
  Iterator IVar11;
  Own<capnp::compiler::BrandScope,_std::nullptr_t> OVar12;
  ResolvedDecl local_590;
  undefined1 local_530 [32];
  ResolvedDecl *local_510;
  ResolvedDecl *parent;
  undefined1 local_4a0 [8];
  NullableValue<capnp::compiler::Resolver::ResolvedDecl> _parent440;
  Array<capnp::compiler::BrandedDecl> local_428;
  ArrayPtr<capnp::compiler::BrandedDecl> *local_410;
  ArrayPtr<capnp::compiler::BrandedDecl> *p;
  undefined1 local_3f0 [8];
  NullableValue<kj::ArrayPtr<capnp::compiler::BrandedDecl>_> _p426;
  Reader local_3c0;
  BrandedDecl local_390;
  Reader local_2e8;
  Own<capnp::compiler::BrandScope,_std::nullptr_t> local_2b0;
  ResolvedDecl local_2a0;
  BrandedDecl local_240;
  undefined1 local_198 [8];
  ResolvedDecl anyPointerDecl;
  Reader binding;
  undefined1 local_f8 [8];
  Iterator __end5;
  undefined1 local_d8 [8];
  Iterator __begin5;
  Reader *__range5;
  ArrayBuilder<capnp::compiler::BrandedDecl> params;
  Reader bindings;
  Reader nextScope;
  uint index_local;
  ResolvedDecl *decl_local;
  Resolver *resolver_local;
  BrandScope *this_local;
  Own<capnp::compiler::BrandScope,_std::nullptr_t> *result;
  
  params_1 = (unsigned_long *)CONCAT44(in_register_0000000c,index);
  kj::refcounted<capnp::compiler::BrandScope,capnp::compiler::ErrorReporter&,unsigned_long&>
            ((kj *)this,(ErrorReporter *)resolver[2]._vptr_Resolver,params_1);
  uVar2 = params_1[1];
  pBVar7 = kj::Own<capnp::compiler::BrandScope,_std::nullptr_t>::operator->
                     ((Own<capnp::compiler::BrandScope,_std::nullptr_t> *)this);
  pBVar7->leafParamCount = (uint)uVar2;
  uVar6 = List<capnp::schema::Brand::Scope,_(capnp::Kind)3>::Reader::size(&brand);
  if (in_R8D < uVar6) {
    List<capnp::schema::Brand::Scope,_(capnp::Kind)3>::Reader::operator[]
              ((Reader *)&bindings.reader.nestingLimit,&brand,in_R8D);
    uVar1 = *params_1;
    uVar8 = capnp::schema::Brand::Scope::Reader::getScopeId((Reader *)&bindings.reader.nestingLimit)
    ;
    if (uVar1 == uVar8) {
      WVar4 = capnp::schema::Brand::Scope::Reader::which((Reader *)&bindings.reader.nestingLimit);
      if (WVar4 == BIND) {
        capnp::schema::Brand::Scope::Reader::getBind
                  ((Reader *)&params.disposer,(Reader *)&bindings.reader.nestingLimit);
        uVar6 = List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Reader::size
                          ((Reader *)&params.disposer);
        kj::heapArrayBuilder<capnp::compiler::BrandedDecl>
                  ((ArrayBuilder<capnp::compiler::BrandedDecl> *)&__range5,(ulong)uVar6);
        __begin5._8_8_ = &params.disposer;
        IVar11 = List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Reader::begin
                           ((Reader *)__begin5._8_8_);
        __end5._8_8_ = IVar11.container;
        __begin5.container._0_4_ = IVar11.index;
        local_d8 = (undefined1  [8])__end5._8_8_;
        IVar11 = List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Reader::end
                           ((Reader *)__begin5._8_8_);
        local_f8 = (undefined1  [8])IVar11.container;
        __end5.container._0_4_ = IVar11.index;
        while (bVar3 = capnp::_::
                       IndexingIterator<const_capnp::List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Reader,_capnp::schema::Brand::Binding::Reader>
                       ::operator==((IndexingIterator<const_capnp::List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Reader,_capnp::schema::Brand::Binding::Reader>
                                     *)local_d8,
                                    (IndexingIterator<const_capnp::List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Reader,_capnp::schema::Brand::Binding::Reader>
                                     *)local_f8), ((bVar3 ^ 0xffU) & 1) != 0) {
          capnp::_::
          IndexingIterator<const_capnp::List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Reader,_capnp::schema::Brand::Binding::Reader>
          ::operator*((Reader *)&anyPointerDecl.brand.ptr.field_1.value._reader.nestingLimit,
                      (IndexingIterator<const_capnp::List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Reader,_capnp::schema::Brand::Binding::Reader>
                       *)local_d8);
          WVar5 = capnp::schema::Brand::Binding::Reader::which
                            ((Reader *)&anyPointerDecl.brand.ptr.field_1.value._reader.nestingLimit)
          ;
          if (WVar5 == UNBOUND) {
            (**(code **)(decl->id + 0x10))(local_198,decl,0x1e);
            Resolver::ResolvedDecl::ResolvedDecl(&local_2a0,(ResolvedDecl *)local_198);
            kj::
            refcounted<capnp::compiler::BrandScope,capnp::compiler::ErrorReporter&,unsigned_long&>
                      ((kj *)&local_2b0,(ErrorReporter *)resolver[2]._vptr_Resolver,
                       (unsigned_long *)&anyPointerDecl.genericParamCount);
            local_2e8._reader.dataSize = 0;
            local_2e8._reader.pointerCount = 0;
            local_2e8._reader._38_2_ = 0;
            local_2e8._reader.nestingLimit = 0;
            local_2e8._reader._44_4_ = 0;
            local_2e8._reader.data = (void *)0x0;
            local_2e8._reader.pointers = (WirePointer *)0x0;
            local_2e8._reader.segment = (SegmentReader *)0x0;
            local_2e8._reader.capTable = (CapTableReader *)0x0;
            Expression::Reader::Reader(&local_2e8);
            source._reader.capTable = local_2e8._reader.capTable;
            source._reader.segment = local_2e8._reader.segment;
            source._reader.data = local_2e8._reader.data;
            source._reader.pointers = local_2e8._reader.pointers;
            source._reader.dataSize = local_2e8._reader.dataSize;
            source._reader.pointerCount = local_2e8._reader.pointerCount;
            source._reader._38_2_ = local_2e8._reader._38_2_;
            source._reader.nestingLimit = local_2e8._reader.nestingLimit;
            source._reader._44_4_ = local_2e8._reader._44_4_;
            BrandedDecl::BrandedDecl(&local_240,&local_2a0,&local_2b0,source);
            kj::ArrayBuilder<capnp::compiler::BrandedDecl>::add<capnp::compiler::BrandedDecl>
                      ((ArrayBuilder<capnp::compiler::BrandedDecl> *)&__range5,&local_240);
            BrandedDecl::~BrandedDecl(&local_240);
            kj::Own<capnp::compiler::BrandScope,_std::nullptr_t>::~Own(&local_2b0);
            Resolver::ResolvedDecl::~ResolvedDecl(&local_2a0);
            Resolver::ResolvedDecl::~ResolvedDecl((ResolvedDecl *)local_198);
          }
          else if (WVar5 == TYPE) {
            capnp::schema::Brand::Binding::Reader::getType
                      (&local_3c0,
                       (Reader *)&anyPointerDecl.brand.ptr.field_1.value._reader.nestingLimit);
            type._reader.capTable = local_3c0._reader.capTable;
            type._reader.segment = local_3c0._reader.segment;
            type._reader.data = local_3c0._reader.data;
            type._reader.pointers = local_3c0._reader.pointers;
            type._reader.dataSize = local_3c0._reader.dataSize;
            type._reader.pointerCount = local_3c0._reader.pointerCount;
            type._reader._38_2_ = local_3c0._reader._38_2_;
            type._reader.nestingLimit = local_3c0._reader.nestingLimit;
            type._reader._44_4_ = local_3c0._reader._44_4_;
            decompileType(&local_390,(BrandScope *)resolver,(Resolver *)decl,type);
            kj::ArrayBuilder<capnp::compiler::BrandedDecl>::add<capnp::compiler::BrandedDecl>
                      ((ArrayBuilder<capnp::compiler::BrandedDecl> *)&__range5,&local_390);
            BrandedDecl::~BrandedDecl(&local_390);
          }
          capnp::_::
          IndexingIterator<const_capnp::List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Reader,_capnp::schema::Brand::Binding::Reader>
          ::operator++((IndexingIterator<const_capnp::List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Reader,_capnp::schema::Brand::Binding::Reader>
                        *)local_d8);
        }
        kj::ArrayBuilder<capnp::compiler::BrandedDecl>::finish
                  ((Array<capnp::compiler::BrandedDecl> *)((long)&_p426.field_1 + 8),
                   (ArrayBuilder<capnp::compiler::BrandedDecl> *)&__range5);
        pBVar7 = kj::Own<capnp::compiler::BrandScope,_std::nullptr_t>::operator->
                           ((Own<capnp::compiler::BrandScope,_std::nullptr_t> *)this);
        kj::Array<capnp::compiler::BrandedDecl>::operator=
                  (&pBVar7->params,(Array<capnp::compiler::BrandedDecl> *)((long)&_p426.field_1 + 8)
                  );
        kj::Array<capnp::compiler::BrandedDecl>::~Array
                  ((Array<capnp::compiler::BrandedDecl> *)((long)&_p426.field_1 + 8));
        kj::ArrayBuilder<capnp::compiler::BrandedDecl>::~ArrayBuilder
                  ((ArrayBuilder<capnp::compiler::BrandedDecl> *)&__range5);
      }
      else if (WVar4 == INHERIT) {
        getParams((Maybe<kj::ArrayPtr<capnp::compiler::BrandedDecl>_> *)&p,(BrandScope *)resolver,
                  *params_1);
        other = kj::_::readMaybe<kj::ArrayPtr<capnp::compiler::BrandedDecl>>
                          ((Maybe<kj::ArrayPtr<capnp::compiler::BrandedDecl>_> *)&p);
        kj::_::NullableValue<kj::ArrayPtr<capnp::compiler::BrandedDecl>_>::NullableValue
                  ((NullableValue<kj::ArrayPtr<capnp::compiler::BrandedDecl>_> *)local_3f0,other);
        kj::Maybe<kj::ArrayPtr<capnp::compiler::BrandedDecl>_>::~Maybe
                  ((Maybe<kj::ArrayPtr<capnp::compiler::BrandedDecl>_> *)&p);
        pAVar9 = kj::_::NullableValue::operator_cast_to_ArrayPtr_((NullableValue *)local_3f0);
        if (pAVar9 == (ArrayPtr<capnp::compiler::BrandedDecl> *)0x0) {
          pBVar7 = kj::Own<capnp::compiler::BrandScope,_std::nullptr_t>::operator->
                             ((Own<capnp::compiler::BrandScope,_std::nullptr_t> *)this);
          pBVar7->inherited = true;
        }
        else {
          local_410 = kj::_::NullableValue<kj::ArrayPtr<capnp::compiler::BrandedDecl>_>::operator*
                                ((NullableValue<kj::ArrayPtr<capnp::compiler::BrandedDecl>_> *)
                                 local_3f0);
          _parent440.field_1._88_8_ = local_410->ptr;
          kj::heapArray<capnp::compiler::BrandedDecl>(&local_428,*local_410);
          pBVar7 = kj::Own<capnp::compiler::BrandScope,_std::nullptr_t>::operator->
                             ((Own<capnp::compiler::BrandScope,_std::nullptr_t> *)this);
          kj::Array<capnp::compiler::BrandedDecl>::operator=(&pBVar7->params,&local_428);
          kj::Array<capnp::compiler::BrandedDecl>::~Array(&local_428);
        }
        kj::_::NullableValue<kj::ArrayPtr<capnp::compiler::BrandedDecl>_>::~NullableValue
                  ((NullableValue<kj::ArrayPtr<capnp::compiler::BrandedDecl>_> *)local_3f0);
      }
    }
  }
  (**(code **)(*(long *)params_1[4] + 0x20))(&parent);
  other_00 = kj::_::readMaybe<capnp::compiler::Resolver::ResolvedDecl>
                       ((Maybe<capnp::compiler::Resolver::ResolvedDecl> *)&parent);
  kj::_::NullableValue<capnp::compiler::Resolver::ResolvedDecl>::NullableValue
            ((NullableValue<capnp::compiler::Resolver::ResolvedDecl> *)local_4a0,other_00);
  kj::Maybe<capnp::compiler::Resolver::ResolvedDecl>::~Maybe
            ((Maybe<capnp::compiler::Resolver::ResolvedDecl> *)&parent);
  pRVar10 = kj::_::NullableValue::operator_cast_to_ResolvedDecl_((NullableValue *)local_4a0);
  if (pRVar10 != (ResolvedDecl *)0x0) {
    local_510 = kj::_::NullableValue<capnp::compiler::Resolver::ResolvedDecl>::operator*
                          ((NullableValue<capnp::compiler::Resolver::ResolvedDecl> *)local_4a0);
    Resolver::ResolvedDecl::ResolvedDecl(&local_590,local_510);
    evaluateBrand((BrandScope *)local_530,resolver,decl,brand,(uint)&local_590);
    kj::Maybe<kj::Own<capnp::compiler::BrandScope,_std::nullptr_t>_>::Maybe
              ((Maybe<kj::Own<capnp::compiler::BrandScope,_std::nullptr_t>_> *)(local_530 + 0x10),
               (Own<capnp::compiler::BrandScope,_std::nullptr_t> *)local_530);
    pBVar7 = kj::Own<capnp::compiler::BrandScope,_std::nullptr_t>::operator->
                       ((Own<capnp::compiler::BrandScope,_std::nullptr_t> *)this);
    kj::Maybe<kj::Own<capnp::compiler::BrandScope,_std::nullptr_t>_>::operator=
              (&pBVar7->parent,
               (Maybe<kj::Own<capnp::compiler::BrandScope,_std::nullptr_t>_> *)(local_530 + 0x10));
    kj::Maybe<kj::Own<capnp::compiler::BrandScope,_std::nullptr_t>_>::~Maybe
              ((Maybe<kj::Own<capnp::compiler::BrandScope,_std::nullptr_t>_> *)(local_530 + 0x10));
    kj::Own<capnp::compiler::BrandScope,_std::nullptr_t>::~Own
              ((Own<capnp::compiler::BrandScope,_std::nullptr_t> *)local_530);
    Resolver::ResolvedDecl::~ResolvedDecl(&local_590);
  }
  kj::_::NullableValue<capnp::compiler::Resolver::ResolvedDecl>::~NullableValue
            ((NullableValue<capnp::compiler::Resolver::ResolvedDecl> *)local_4a0);
  OVar12.ptr = extraout_RDX;
  OVar12.disposer = (Disposer *)this;
  return OVar12;
}

Assistant:

kj::Own<BrandScope> BrandScope::evaluateBrand(
    Resolver& resolver, Resolver::ResolvedDecl decl,
    List<schema::Brand::Scope>::Reader brand, uint index) {
  auto result = kj::refcounted<BrandScope>(errorReporter, decl.id);
  result->leafParamCount = decl.genericParamCount;

  // Fill in `params`.
  if (index < brand.size()) {
    auto nextScope = brand[index];
    if (decl.id == nextScope.getScopeId()) {
      // Initialize our parameters.

      switch (nextScope.which()) {
        case schema::Brand::Scope::BIND: {
          auto bindings = nextScope.getBind();
          auto params = kj::heapArrayBuilder<BrandedDecl>(bindings.size());
          for (auto binding: bindings) {
            switch (binding.which()) {
              case schema::Brand::Binding::UNBOUND: {
                // Build an AnyPointer-equivalent.
                auto anyPointerDecl = resolver.resolveBuiltin(Declaration::BUILTIN_ANY_POINTER);
                params.add(BrandedDecl(anyPointerDecl,
                    kj::refcounted<BrandScope>(errorReporter, anyPointerDecl.scopeId),
                    Expression::Reader()));
                break;
              }

              case schema::Brand::Binding::TYPE:
                // Reverse this schema::Type back into a BrandedDecl.
                params.add(decompileType(resolver, binding.getType()));
                break;
            }
          }
          result->params = params.finish();
          break;
        }

        case schema::Brand::Scope::INHERIT:
          KJ_IF_SOME(p, getParams(decl.id)) {
            result->params = kj::heapArray(p);
          } else {
            result->inherited = true;
          }
          break;
      }

      // Parent should start one level deeper in the list.
      ++index;
    }
  }